

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bestfit.cpp
# Opt level: O3

bool overlapAABB(float *bmin1,float *bmax1,float *bmin2,float *bmax2)

{
  if ((((*bmin1 <= *bmax2) && (bmin1[1] <= bmax2[1])) && (bmin1[2] <= bmax2[2])) &&
     ((*bmin2 <= *bmax1 && (bmin2[1] <= bmax1[1])))) {
    return bmin2[2] <= bmax1[2];
  }
  return false;
}

Assistant:

bool  overlapAABB(const float *bmin1,const float *bmax1,const float *bmin2,const float *bmax2) // return true if the two AABB's overlap.
{
  if ( bmax2[0] < bmin1[0] ) return false; // if the maximum is less than our minimum on any axis
  if ( bmax2[1] < bmin1[1] ) return false;
  if ( bmax2[2] < bmin1[2] ) return false;

  if ( bmin2[0] > bmax1[0] ) return false; // if the minimum is greater than our maximum on any axis
  if ( bmin2[1] > bmax1[1] ) return false; // if the minimum is greater than our maximum on any axis
  if ( bmin2[2] > bmax1[2] ) return false; // if the minimum is greater than our maximum on any axis


  return true; // the extents overlap
}